

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::RegexMatch
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  const_reference pvVar2;
  char *pcVar3;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *r_00;
  size_type sVar4;
  string local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  string e_1;
  size_type r;
  size_type l;
  string output;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1b8;
  undefined1 local_1a8 [8];
  string input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string e;
  RegularExpression re;
  undefined1 local_60 [8];
  string outvar;
  string regex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,2);
  std::__cxx11::string::string((string *)(outvar.field_2._M_local_buf + 8),(string *)pvVar2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,3);
  std::__cxx11::string::string((string *)local_60,(string *)pvVar2);
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  cmsys::RegularExpression::RegularExpression((RegularExpression *)((long)&e.field_2 + 8));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::compile((RegularExpression *)((long)&e.field_2 + 8),pcVar3);
  if (!bVar1) {
    std::operator+(&local_180,"sub-command REGEX, mode MATCH failed to compile regex \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&outvar.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                   &local_180,"\".");
    std::__cxx11::string::~string((string *)&local_180);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_160);
    this_local._7_1_ = false;
    input.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_160);
    goto LAB_004f537c;
  }
  local_1b8 = cmMakeRange<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (args);
  r_00 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::advance(&local_1b8,4);
  std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8));
  cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((string *)local_1a8,r_00,(string *)(output.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&l);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::find((RegularExpression *)((long)&e.field_2 + 8),pcVar3);
  if (bVar1) {
    cmMakefile::StoreMatches
              ((this->super_cmCommand).Makefile,(RegularExpression *)((long)&e.field_2 + 8));
    sVar4 = cmsys::RegularExpression::start((RegularExpression *)((long)&e.field_2 + 8));
    e_1.field_2._8_8_ = cmsys::RegularExpression::end((RegularExpression *)((long)&e.field_2 + 8));
    if (e_1.field_2._8_8_ != sVar4) {
      std::__cxx11::string::substr((ulong)local_268,(ulong)local_1a8);
      std::__cxx11::string::operator=((string *)&l,local_268);
      std::__cxx11::string::~string(local_268);
      goto LAB_004f5307;
    }
    std::operator+(&local_248,"sub-command REGEX, mode MATCH regex \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&outvar.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                   &local_248,"\" matched an empty string.");
    std::__cxx11::string::~string((string *)&local_248);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_228);
    this_local._7_1_ = false;
    input.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_228);
  }
  else {
LAB_004f5307:
    this_00 = (this->super_cmCommand).Makefile;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(this_00,(string *)local_60,pcVar3);
    this_local._7_1_ = true;
    input.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)&l);
  std::__cxx11::string::~string((string *)local_1a8);
LAB_004f537c:
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)((long)&e.field_2 + 8));
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(outvar.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool cmStringCommand::RegexMatch(std::vector<std::string> const& args)
{
  //"STRING(REGEX MATCH <regular_expression> <output variable>
  // <input> [<input>...])\n";
  std::string regex = args[2];
  std::string outvar = args[3];

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if(!re.compile(regex.c_str()))
    {
    std::string e =
      "sub-command REGEX, mode MATCH failed to compile regex \""+regex+"\".";
    this->SetError(e);
    return false;
    }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  if(re.find(input.c_str()))
    {
    this->Makefile->StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if(r-l == 0)
      {
      std::string e =
        "sub-command REGEX, mode MATCH regex \""+regex+
        "\" matched an empty string.";
      this->SetError(e);
      return false;
      }
    output = input.substr(l, r-l);
    }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}